

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

bool __thiscall
gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInVertexShaderTest
          (CoverageTest *this,Functions *gl)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  string *psVar2;
  MessageBuilder *pMVar3;
  bool bVar4;
  vector<int,_std::allocator<int>_> results;
  VertexArrayObject vertex_array_object;
  _Vector_base<int,_std::allocator<int>_> local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transform_feedback_varyings;
  string transform_feedback_varying_name;
  string fragment_shader;
  string vertex_shader;
  VertexBufferObject<int> vertex_buffer_object;
  Program program;
  undefined1 local_1a8 [384];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertex_shader,m_vertex_shader_code_case_0,(allocator<char> *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragment_shader,m_fragment_shader_code_case_0,(allocator<char> *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&transform_feedback_varying_name,"max_value",(allocator<char> *)local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&transform_feedback_varyings,1,&transform_feedback_varying_name,
           (allocator_type *)local_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e8,&transform_feedback_varyings);
  Utility::Program::Program(&program,gl,&vertex_shader,&fragment_shader,&local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8);
  if (program.m_program_status.program_id == 0) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Program failed to build.\n Vertex Shader:\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1a8,&m_vertex_shader_code_case_0);
    poVar1 = &pMVar3->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\nVertex Shader compilation log:\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    (string *)&program.m_vertex_shader_status.shader_log);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\nWith Fragment Shader:\n");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&m_fragment_shader_code_case_0);
    poVar1 = &pMVar3->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\nWith Fragment Shader compilation log:\n");
    psVar2 = &program.m_fragment_shader_status.shader_log;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,(string *)psVar2);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\nWith Program linkage log:\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,(string *)psVar2);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    bVar4 = false;
    goto LAB_00ae7f90;
  }
  Utility::Program::UseProgram(&program);
  Utility::VertexArrayObject::VertexArrayObject(&vertex_array_object,gl,0);
  local_1a8._0_8_ = (ulong)(uint)local_1a8._4_4_ << 0x20;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_300,1,(value_type_conflict1 *)local_1a8,
             (allocator_type *)&results);
  Utility::VertexBufferObject<int>::VertexBufferObject
            (&vertex_buffer_object,gl,0x8c8e,(vector<int,_std::allocator<int>_> *)&local_300);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_300);
  Utility::VertexArrayObject::drawWithTransformFeedback(&vertex_array_object,0,1,true);
  Utility::VertexBufferObject<int>::readBuffer(&results,&vertex_buffer_object);
  if (results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
    std::operator<<((ostream *)(local_1a8 + 8),"Results reading error.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ae7f67:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (*results.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start != this->m_gl_max_clip_distances_value) {
      local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
      std::operator<<((ostream *)(local_1a8 + 8),
                      "Vertex shader\'s gl_MaxClipDistances constant has improper value equal to ");
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1a8,
                          results.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"but ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_gl_max_clip_distances_value);
      std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "is expected. Test failed.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00ae7f67;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&results.super__Vector_base<int,_std::allocator<int>_>);
  Utility::VertexBufferObject<int>::~VertexBufferObject(&vertex_buffer_object);
  Utility::VertexArrayObject::~VertexArrayObject(&vertex_array_object);
LAB_00ae7f90:
  Utility::Program::~Program(&program);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&transform_feedback_varyings);
  std::__cxx11::string::~string((string *)&transform_feedback_varying_name);
  std::__cxx11::string::~string((string *)&fragment_shader);
  std::__cxx11::string::~string((string *)&vertex_shader);
  return bVar4;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInVertexShaderTest(const glw::Functions& gl)
{
	/*  Make a program that consist of vertex and fragment shader stages. A
	 vertex shader shall assign the value of gl_MaxClipDistances to transform
	 feedback output variable. Setup gl_Position with passed in attribute.
	 Use blank fragment shader. Check that the shaders compiles and links
	 successfully. Draw a single GL_POINT with screen centered position
	 attribute, a configured transform feedback and GL_RASTERIZER_DISCARD.
	 Query transform feedback value and compare it against
	 GL_MAX_CLIP_DISTANCES. Expect that both values are equal. */

	/* Building program. */
	const std::string vertex_shader					  = m_vertex_shader_code_case_0;
	const std::string fragment_shader				  = m_fragment_shader_code_case_0;
	std::string		  transform_feedback_varying_name = "max_value";

	std::vector<std::string> transform_feedback_varyings(1, transform_feedback_varying_name);

	gl3cts::ClipDistance::Utility::Program program(gl, vertex_shader, fragment_shader, transform_feedback_varyings);

	if (program.ProgramStatus().program_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program failed to build.\n Vertex Shader:\n"
						   << m_vertex_shader_code_case_0 << "\nVertex Shader compilation log:\n"
						   << program.VertexShaderStatus().shader_log << "\nWith Fragment Shader:\n"
						   << m_fragment_shader_code_case_0 << "\nWith Fragment Shader compilation log:\n"
						   << program.FragmentShaderStatus().shader_log << "\nWith Program linkage log:\n"
						   << program.FragmentShaderStatus().shader_log << "\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	program.UseProgram();

	/* Creating and binding empty VAO. */
	gl3cts::ClipDistance::Utility::VertexArrayObject vertex_array_object(gl, GL_POINTS);

	/* Creating and binding output VBO */
	gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLint> vertex_buffer_object(gl, GL_TRANSFORM_FEEDBACK_BUFFER,
																					   std::vector<glw::GLint>(1, 0));

	/* Draw test. */
	vertex_array_object.drawWithTransformFeedback(0, 1, true);

	/* Check results. */
	std::vector<glw::GLint> results = vertex_buffer_object.readBuffer();

	if (results.size() < 1)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Results reading error." << tcu::TestLog::EndMessage;
		return false;
	}

	if (results[0] != m_gl_max_clip_distances_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Vertex shader's gl_MaxClipDistances constant has improper value equal to " << results[0]
						   << "but " << m_gl_max_clip_distances_value << "is expected. Test failed."
						   << tcu::TestLog::EndMessage;
		return false;
	}

	/* Test passed. */
	return true;
}